

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O1

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3<long> *Val)

{
  ulong uVar1;
  byte in_AL;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  anon_union_8_2_2df48d06_for_stref_0 local_60;
  undefined4 local_58;
  anon_union_8_2_2df48d06_for_stref_0 local_50;
  undefined4 local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  bVar7 = 4 < NArgs;
  if (4 < NArgs) {
    iVar3 = strncmp(Args[1],Opt,0x20);
    if (iVar3 == 0) {
      uVar6 = 4;
      lVar5 = 1;
    }
    else {
      uVar1 = 5;
      do {
        uVar6 = uVar1;
        if (uVar6 + (2 - (ulong)(NArgs - 3)) == 5) {
          bVar7 = uVar6 < (uint)NArgs;
          in_AL = 5;
          goto LAB_0010448e;
        }
        iVar3 = strncmp(Args[uVar6 - 3],Opt,0x20);
        uVar1 = uVar6 + 1;
      } while (iVar3 != 0);
      bVar7 = uVar6 < (uint)NArgs;
      lVar5 = uVar6 - 3;
    }
    local_40 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + 1))->Ptr;
    sVar4 = strlen(local_40.Ptr);
    local_38 = (undefined4)sVar4;
    bVar2 = ToInt64((stref *)&local_40,(i64 *)Val);
    if (bVar2) {
      local_50 = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + 2))->Ptr;
      sVar4 = strlen(local_50.Ptr);
      local_48 = (undefined4)sVar4;
      bVar2 = ToInt64((stref *)&local_50,&(Val->field_0).field_0.Y);
      if (bVar2) {
        local_60 = (anon_union_8_2_2df48d06_for_stref_0)
                   ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + uVar6))->Ptr;
        sVar4 = strlen(local_60.Ptr);
        local_58 = (undefined4)sVar4;
        in_AL = ToInt64((stref *)&local_60,&(Val->field_0).field_0.Z);
        goto LAB_0010448e;
      }
    }
    in_AL = 0;
  }
LAB_0010448e:
  return (bool)(bVar7 & in_AL);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3<i64>* Val)
{
  for (int I = 1; I + 3 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      return ToInt64(Args[I + 1], &Val->X) && ToInt64(Args[I + 2], &Val->Y) &&
             ToInt64(Args[I + 3], &Val->Z);
    }
  }

  return false;
}